

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O3

void __thiscall mognetwork::Selector::waitForTrigger(Selector *this)

{
  int iVar1;
  
  this->m_state = Waiting;
  setFds(this);
  iVar1 = select(this->m_maxFds + 1,(fd_set *)&this->m_rdfs,(fd_set *)&this->m_wdfs,(fd_set *)0x0,
                 (timeval *)this->m_timeout);
  if (iVar1 != -1) {
    updateFds(this);
    return;
  }
  this->m_state = Error;
  return;
}

Assistant:

void Selector::waitForTrigger()
  {
    m_state = Waiting;
    setFds();
#ifndef OS_WINDOWS
    if (select(m_maxFds + 1, &m_rdfs, &m_wdfs, NULL, m_timeout) == -1)
	{
#else
	if (select(m_maxFds + 1, &m_rdfs, &m_wdfs, NULL, m_timeout) == SOCKET_ERROR)
	{
#endif // !OS_WINDOWS
		m_state = Error;
	}
    else
      updateFds();
  }
}